

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

string * __thiscall
symbols::BuiltinFunction::toString_abi_cxx11_(string *__return_storage_ptr__,BuiltinFunction *this)

{
  ostream *poVar1;
  ostringstream out;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"built-in: ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->func_name)._M_dataplus._M_p,
                      (this->func_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"() function",0xb);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltinFunction::toString() const
{
    std::ostringstream out;
    out << "built-in: " << func_name << "() function";
    return out.str();
}